

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O3

Aig_Man_t * Rtm_ManRetime(Aig_Man_t *p,int fForward,int nStepsMax,int fVerbose)

{
  Rtm_Obj_t *pObj;
  Rtm_Obj_t *pObj_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Rtm_Man_t *p_00;
  uint *__ptr;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  Aig_Man_t *p_01;
  size_t sVar7;
  char *pcVar8;
  Aig_Man_t *pAVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  char *pcVar17;
  ulong uVar18;
  timespec ts;
  ulong local_98;
  ulong local_88;
  timespec local_78;
  int local_64;
  ulong local_60;
  int local_54;
  long local_50;
  Rtm_Man_t *local_48;
  Aig_Man_t *local_40;
  long local_38;
  
  local_64 = fVerbose;
  local_54 = nStepsMax;
  iVar1 = clock_gettime(3,&local_78);
  if (iVar1 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  p_00 = Rtm_ManFromAig(p);
  uVar15 = p->nObjs[2] - p->nRegs;
  pVVar5 = p->vCis;
  if ((int)uVar15 < pVVar5->nSize) {
    uVar18 = (ulong)uVar15;
    do {
      if ((int)uVar15 < 0) goto LAB_006151b1;
      Rtm_ObjAddFirst(p_00,(Rtm_Edg_t *)(*(long *)((long)pVVar5->pArray[uVar18] + 0x28) + 0x20),
                      (uint)(fForward == 0) * 2 + RTM_VAL_ZERO);
      uVar18 = uVar18 + 1;
      pVVar5 = p->vCis;
    } while ((int)uVar18 < pVVar5->nSize);
  }
  if (fForward == 0) {
    uVar15 = Rtm_ManMarkAutoBwd(p_00);
  }
  else {
    uVar15 = Rtm_ManMarkAutoFwd(p_00);
  }
  if (local_64 != 0) {
    iVar1 = 0x919e31;
    printf("Detected %d autonomous objects. ",(ulong)uVar15);
    Abc_Print(iVar1,"%s =","Time");
    iVar16 = 3;
    iVar1 = clock_gettime(3,&local_78);
    if (iVar1 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar12 + lVar11) / 1000000.0);
  }
  pVVar5 = p_00->vObjs;
  if (0 < pVVar5->nSize) {
    lVar11 = 0;
    do {
      pvVar4 = pVVar5->pArray[lVar11];
      uVar15 = *(uint *)((long)pvVar4 + 8);
      if ((uVar15 >> 7 & 0xff) != uVar15 >> 0xf) {
        __assert_fail("pObj->nFanins == pObj->Num",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                      ,0x360,"Aig_Man_t *Rtm_ManRetime(Aig_Man_t *, int, int, int)");
      }
      if (*(int *)((long)pvVar4 + 0x14) != *(int *)((long)pvVar4 + 0x10)) {
        __assert_fail("pObj->nFanouts == pObj->Temp",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                      ,0x361,"Aig_Man_t *Rtm_ManRetime(Aig_Man_t *, int, int, int)");
      }
      *(uint *)((long)pvVar4 + 8) = uVar15 & 0x7fff;
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar5->nSize);
  }
  iVar1 = clock_gettime(3,&local_78);
  if (iVar1 < 0) {
    local_50 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_50 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[1] = 0;
  pvVar4 = malloc(8000);
  *(void **)(__ptr + 2) = pvVar4;
  if (fForward == 0) {
    uVar15 = p->nObjs[3] - p->nRegs;
    pVVar5 = p->vCos;
    if ((int)uVar15 < pVVar5->nSize) {
      uVar18 = (ulong)uVar15;
      local_98 = 0;
      local_88 = 1000;
      do {
        if ((int)uVar15 < 0) goto LAB_006151b1;
        lVar11 = *(long *)((long)pVVar5->pArray[uVar18] + 0x28);
        if ((*(uint *)(lVar11 + 8) & 0x10) == 0) {
          *(uint *)(lVar11 + 8) = *(uint *)(lVar11 + 8) | 8;
          iVar1 = (int)local_88;
          if ((int)local_98 == iVar1) {
            if (iVar1 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc(0x80);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
              }
              *(void **)(__ptr + 2) = pvVar4;
              *__ptr = 0x10;
              local_88 = 0x10;
            }
            else {
              local_88 = (ulong)(uint)(iVar1 * 2);
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc(local_88 * 8);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),local_88 * 8);
              }
              *(void **)(__ptr + 2) = pvVar4;
              *__ptr = iVar1 * 2;
            }
          }
          else {
            pvVar4 = *(void **)(__ptr + 2);
          }
          __ptr[1] = (int)local_98 + 1U;
          *(long *)((long)pvVar4 + (long)(int)local_98 * 8) = lVar11;
          pVVar5 = p->vCos;
          local_98 = (ulong)((int)local_98 + 1U);
        }
        uVar18 = uVar18 + 1;
      } while ((int)uVar18 < pVVar5->nSize);
      goto LAB_00614c00;
    }
LAB_00614f56:
    local_98 = 0;
  }
  else {
    uVar15 = p->nObjs[2] - p->nRegs;
    pVVar5 = p->vCis;
    if (pVVar5->nSize <= (int)uVar15) goto LAB_00614f56;
    uVar18 = (ulong)uVar15;
    local_98 = 0;
    local_88 = 1000;
    do {
      if ((int)uVar15 < 0) {
LAB_006151b1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar11 = *(long *)((long)pVVar5->pArray[uVar18] + 0x28);
      if ((*(uint *)(lVar11 + 8) & 0x10) == 0) {
        *(uint *)(lVar11 + 8) = *(uint *)(lVar11 + 8) | 8;
        iVar1 = (int)local_88;
        if ((int)local_98 == iVar1) {
          if (iVar1 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar4 = malloc(0x80);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar4;
            *__ptr = 0x10;
            local_88 = 0x10;
          }
          else {
            local_88 = (ulong)(uint)(iVar1 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar4 = malloc(local_88 * 8);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr + 2),local_88 * 8);
            }
            *(void **)(__ptr + 2) = pvVar4;
            *__ptr = iVar1 * 2;
          }
        }
        else {
          pvVar4 = *(void **)(__ptr + 2);
        }
        __ptr[1] = (int)local_98 + 1U;
        *(long *)((long)pvVar4 + (long)(int)local_98 * 8) = lVar11;
        pVVar5 = p->vCis;
        local_98 = (ulong)((int)local_98 + 1U);
      }
      uVar18 = uVar18 + 1;
    } while ((int)uVar18 < pVVar5->nSize);
LAB_00614c00:
    if (0 < (int)local_98) {
      lVar11 = 0;
      local_60 = local_88;
      uVar15 = 0;
      local_48 = p_00;
      local_40 = p;
      do {
        pObj = *(Rtm_Obj_t **)(*(long *)(__ptr + 2) + lVar11 * 8);
        *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0xfffffff7;
        local_38 = lVar11;
        if (fForward == 0) {
          Rtm_ObjRetimeBwd(local_48,pObj);
          uVar3 = *(uint *)&pObj->field_0x8;
          if ((uVar3 & 0x7f80) != 0) {
            uVar18 = 0;
            do {
              pObj_00 = (Rtm_Obj_t *)(&pObj[1].pCopy)[uVar18 * 2];
              uVar10 = *(uint *)&pObj_00->field_0x8;
              if (((uVar10 & 0x7f80) != 0 && (char)((uVar10 & 8) >> 3) == '\0') &&
                 (iVar1 = Rtm_ObjCheckRetimeBwd(pObj_00), iVar1 != 0)) {
                if ((long)pObj_00->nFanouts < 1) {
                  uVar13 = 1;
                }
                else {
                  lVar11 = 0;
                  uVar13 = 0;
                  do {
                    uVar2 = *(uint *)(*(long *)((long)&pObj_00[1].pCopy +
                                               lVar11 + (ulong)(uVar10 >> 3 & 0xff0)) + 8) >> 0xf;
                    if (uVar2 < uVar13) {
                      uVar2 = uVar13;
                    }
                    uVar13 = uVar2;
                    lVar11 = lVar11 + 0x10;
                  } while ((long)pObj_00->nFanouts * 0x10 != lVar11);
                  uVar13 = uVar13 + 1;
                }
                if (uVar15 <= uVar13) {
                  uVar15 = uVar13;
                }
                if ((int)uVar13 <= local_54) {
                  *(uint *)&pObj_00->field_0x8 = uVar13 * 0x8000 + (uVar10 & 0x7ff7) + 8;
                  iVar1 = (int)local_88;
                  if ((int)local_98 == iVar1) {
                    if (iVar1 < 0x10) {
                      if (*(void **)(__ptr + 2) == (void *)0x0) {
                        pvVar4 = malloc(0x80);
                      }
                      else {
                        pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
                      }
                      *(void **)(__ptr + 2) = pvVar4;
                      *__ptr = 0x10;
                      local_88 = 0x10;
                    }
                    else {
                      local_88 = (ulong)(uint)(iVar1 * 2);
                      if (*(void **)(__ptr + 2) == (void *)0x0) {
                        pvVar4 = malloc(local_88 * 8);
                      }
                      else {
                        pvVar4 = realloc(*(void **)(__ptr + 2),local_88 * 8);
                      }
                      *(void **)(__ptr + 2) = pvVar4;
                      *__ptr = iVar1 * 2;
                    }
                  }
                  else {
                    pvVar4 = *(void **)(__ptr + 2);
                  }
                  lVar11 = (long)(int)local_98;
                  local_98 = (ulong)((int)local_98 + 1);
                  *(Rtm_Obj_t **)((long)pvVar4 + lVar11 * 8) = pObj_00;
                  uVar3 = *(uint *)&pObj->field_0x8;
                  local_60 = local_88;
                }
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 < (uVar3 >> 7 & 0xff));
          }
        }
        else {
          Rtm_ObjRetimeFwd(local_48,pObj);
          iVar1 = pObj->nFanouts;
          if (0 < iVar1) {
            iVar16 = 0;
            do {
              pvVar4 = (&pObj[1].pCopy)[((*(uint *)&pObj->field_0x8 >> 7 & 0xff) + iVar16) * 2];
              uVar3 = *(uint *)((long)pvVar4 + 8);
              if ((uVar3 & 0xf) == 0) {
                uVar10 = uVar3 >> 7 & 0xff;
                if (uVar10 == 0) {
                  uVar10 = 1;
                }
                else {
                  uVar18 = (ulong)(uVar10 << 4);
                  uVar14 = 0;
                  do {
                    if ((*(ushort *)((long)pvVar4 + uVar14 + 0x20) & 0xfff) == 0) goto LAB_00614c7c;
                    uVar14 = uVar14 + 0x10;
                  } while (uVar18 != uVar14);
                  uVar14 = 0;
                  uVar10 = 0;
                  do {
                    uVar13 = *(uint *)(*(long *)((long)pvVar4 + uVar14 + 0x18) + 8) >> 0xf;
                    if (uVar13 < uVar10) {
                      uVar13 = uVar10;
                    }
                    uVar10 = uVar13;
                    uVar14 = uVar14 + 0x10;
                  } while (uVar18 != uVar14);
                  uVar10 = uVar10 + 1;
                }
                if (uVar15 <= uVar10) {
                  uVar15 = uVar10;
                }
                if ((int)uVar10 <= local_54) {
                  *(uint *)((long)pvVar4 + 8) = uVar10 * 0x8000 + (uVar3 & 0x7ff0) + 8;
                  iVar1 = (int)local_60;
                  if ((int)local_98 == iVar1) {
                    if (iVar1 < 0x10) {
                      if (*(void **)(__ptr + 2) == (void *)0x0) {
                        pvVar6 = malloc(0x80);
                      }
                      else {
                        pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
                      }
                      *(void **)(__ptr + 2) = pvVar6;
                      *__ptr = 0x10;
                      local_88 = 0x10;
                      local_60 = 0x10;
                    }
                    else {
                      local_60 = (ulong)(uint)(iVar1 * 2);
                      if (*(void **)(__ptr + 2) == (void *)0x0) {
                        pvVar6 = malloc(local_60 * 8);
                      }
                      else {
                        pvVar6 = realloc(*(void **)(__ptr + 2),local_60 * 8);
                      }
                      *(void **)(__ptr + 2) = pvVar6;
                      *__ptr = (uint)local_60;
                      local_88 = local_60;
                    }
                  }
                  else {
                    pvVar6 = *(void **)(__ptr + 2);
                  }
                  lVar11 = (long)(int)local_98;
                  local_98 = (ulong)((int)local_98 + 1);
                  *(void **)((long)pvVar6 + lVar11 * 8) = pvVar4;
                  iVar1 = pObj->nFanouts;
                }
              }
LAB_00614c7c:
              iVar16 = iVar16 + 1;
            } while (iVar16 < iVar1);
          }
        }
        lVar11 = local_38 + 1;
        p = local_40;
        p_00 = local_48;
      } while (lVar11 < (int)local_98);
      goto LAB_00614f60;
    }
  }
  uVar15 = 0;
LAB_00614f60:
  if (local_64 != 0) {
    pcVar17 = "fwd";
    if (fForward == 0) {
      pcVar17 = "bwd";
    }
    uVar3 = Rtm_ManLatchMax(p_00);
    printf("Performed %d %s latch moves of max depth %d and max latch count %d.\n",local_98,pcVar17,
           (ulong)uVar15,(ulong)uVar3);
    iVar1 = 0x919f08;
    printf("Memory usage = %d.  ",(ulong)(uint)p_00->nExtraCur);
    Abc_Print(iVar1,"%s =","Time");
    iVar16 = 3;
    iVar1 = clock_gettime(3,&local_78);
    if (iVar1 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar11 + local_50) / 1000000.0);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  p_01 = Rtm_ManToAig(p_00);
  pcVar17 = p->pName;
  if (pcVar17 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar17);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar17);
  }
  p_01->pName = pcVar8;
  pcVar17 = p->pSpec;
  if (pcVar17 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar17);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar17);
  }
  p_01->pSpec = pcVar8;
  Rtm_ManFree(p_00);
  iVar16 = clock_gettime(3,&local_78);
  iVar1 = local_64;
  if (iVar16 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  pAVar9 = Aig_ManReduceLaches(p_01,local_64);
  if (iVar1 != 0) {
    Abc_Print((int)p_01,"%s =","Register sharing time");
    iVar16 = 3;
    iVar1 = clock_gettime(3,&local_78);
    if (iVar1 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar12 + lVar11) / 1000000.0);
  }
  return pAVar9;
}

Assistant:

Aig_Man_t * Rtm_ManRetime( Aig_Man_t * p, int fForward, int nStepsMax, int fVerbose )
{
    Vec_Ptr_t * vQueue;
    Aig_Man_t * pNew;
    Rtm_Man_t * pRtm;
    Rtm_Obj_t * pObj, * pNext;
    Aig_Obj_t * pObjAig;
    int i, k, nAutos, Degree, DegreeMax = 0; 
    abctime clk;

    // create the retiming manager
clk = Abc_Clock();
    pRtm = Rtm_ManFromAig( p );
    // set registers
    Aig_ManForEachLoSeq( p, pObjAig, i )
        Rtm_ObjAddFirst( pRtm, Rtm_ObjEdge((Rtm_Obj_t *)pObjAig->pData, 0), fForward? RTM_VAL_ZERO : RTM_VAL_VOID );
    // detect and mark the autonomous components
    if ( fForward )
        nAutos = Rtm_ManMarkAutoFwd( pRtm );
    else
        nAutos = Rtm_ManMarkAutoBwd( pRtm );
    if ( fVerbose )
    {
        printf( "Detected %d autonomous objects. ", nAutos );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // set the current retiming number
    Rtm_ManForEachObj( pRtm, pObj, i )
    {
        assert( pObj->nFanins == pObj->Num );
        assert( pObj->nFanouts == pObj->Temp );
        pObj->Num = 0;
    }

clk = Abc_Clock();
    // put the LOs on the queue
    vQueue = Vec_PtrAlloc( 1000 );
    if ( fForward )
    {
        Aig_ManForEachLoSeq( p, pObjAig, i )
        {
            pObj = (Rtm_Obj_t *)pObjAig->pData;
            if ( pObj->fAuto )
                continue;
            pObj->fMark = 1;
            Vec_PtrPush( vQueue, pObj );
        }
    }
    else
    {
        Aig_ManForEachLiSeq( p, pObjAig, i )
        {
            pObj = (Rtm_Obj_t *)pObjAig->pData;
            if ( pObj->fAuto )
                continue;
            pObj->fMark = 1;
            Vec_PtrPush( vQueue, pObj );
        }
    }
    // perform retiming 
    DegreeMax = 0;
    Vec_PtrForEachEntry( Rtm_Obj_t *, vQueue, pObj, i )
    {
        pObj->fMark = 0;
        // retime the node 
        if ( fForward )
        {
            Rtm_ObjRetimeFwd( pRtm, pObj );
            // check if its fanouts should be retimed
            Rtm_ObjForEachFanout( pObj, pNext, k )
            {
                if ( pNext->fMark ) // skip aleady scheduled
                    continue;
                if ( pNext->Type ) // skip POs
                    continue;
                if ( !Rtm_ObjCheckRetimeFwd( pNext ) ) // skip non-retimable
                    continue;
                Degree = Rtm_ObjGetDegreeFwd( pNext );
                DegreeMax = Abc_MaxInt( DegreeMax, Degree );
                if ( Degree > nStepsMax ) // skip nodes with high degree
                    continue;
                pNext->fMark = 1;
                pNext->Num = Degree;
                Vec_PtrPush( vQueue, pNext );
            }
        }
        else
        {
            Rtm_ObjRetimeBwd( pRtm, pObj );
            // check if its fanouts should be retimed
            Rtm_ObjForEachFanin( pObj, pNext, k )
            {
                if ( pNext->fMark ) // skip aleady scheduled
                    continue;
                if ( pNext->nFanins == 0 ) // skip PIs
                    continue;
                if ( !Rtm_ObjCheckRetimeBwd( pNext ) ) // skip non-retimable
                    continue;
                Degree = Rtm_ObjGetDegreeBwd( pNext );
                DegreeMax = Abc_MaxInt( DegreeMax, Degree );
                if ( Degree > nStepsMax ) // skip nodes with high degree
                    continue;
                pNext->fMark = 1;
                pNext->Num = Degree;
                Vec_PtrPush( vQueue, pNext );
            }
        }
    }

    if ( fVerbose )
    {
        printf( "Performed %d %s latch moves of max depth %d and max latch count %d.\n", 
            Vec_PtrSize(vQueue), fForward? "fwd":"bwd", DegreeMax, Rtm_ManLatchMax(pRtm) );
        printf( "Memory usage = %d.  ", pRtm->nExtraCur );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    Vec_PtrFree( vQueue );

    // get the new manager
    pNew = Rtm_ManToAig( pRtm );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Rtm_ManFree( pRtm );
    // group the registers
clk = Abc_Clock();
    pNew = Aig_ManReduceLaches( pNew, fVerbose );
    if ( fVerbose )
    {
        ABC_PRT( "Register sharing time", Abc_Clock() - clk );
    }
    return pNew;
}